

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_quad_mesh.h
# Opt level: O1

PrimInfo * __thiscall
embree::sse2::QuadMeshISA::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,QuadMeshISA *this,mvector<PrimRef> *prims,size_t itime,
          range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  long lVar3;
  BufferView<embree::Vec3fa> *pBVar4;
  ulong uVar5;
  char *pcVar6;
  PrimRef *pPVar7;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar8;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar9;
  size_t sVar10;
  ulong uVar11;
  undefined4 uVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  bool bVar19;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar24;
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar26;
  undefined1 auVar27 [16];
  anon_struct_12_3_4e92e0dd_for_anon_union_16_2_47237d3f_for_Vec3fa_0_1 aVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar34;
  undefined1 auVar35 [16];
  
  aVar20 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       _DAT_01feb9f0;
  aVar21 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar21;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar14 = r->_begin;
  sVar10 = __return_storage_ptr__->end;
  aVar22 = aVar21;
  aVar23 = aVar20;
  if (uVar14 < r->_end) {
    aVar8 = DAT_01feba00._0_12_;
    aVar9 = DAT_01feb9f0._0_12_;
    do {
      lVar3 = *(long *)&(this->super_QuadMesh).super_Geometry.field_0x58;
      pBVar4 = (this->super_QuadMesh).vertices.items;
      lVar17 = *(long *)&(this->super_QuadMesh).field_0x68 * uVar14;
      uVar16 = (ulong)*(uint *)(lVar3 + lVar17);
      uVar5 = (pBVar4->super_RawBufferView).num;
      aVar28 = aVar9;
      aVar24 = aVar8;
      if ((((uVar16 < uVar5) && (uVar18 = (ulong)*(uint *)(lVar3 + 4 + lVar17), uVar18 < uVar5)) &&
          (uVar11 = (ulong)*(uint *)(lVar3 + 8 + lVar17), uVar11 < uVar5)) &&
         (uVar15 = (ulong)*(uint *)(lVar3 + 0xc + lVar17), uVar15 < uVar5)) {
        pcVar6 = pBVar4[itime].super_RawBufferView.ptr_ofs;
        sVar13 = pBVar4[itime].super_RawBufferView.stride;
        auVar25 = *(undefined1 (*) [16])(pcVar6 + sVar13 * uVar16);
        auVar27._0_4_ = -(uint)(auVar25._0_4_ < 1.844e+18 && -1.844e+18 < auVar25._0_4_);
        auVar27._4_4_ = -(uint)(auVar25._4_4_ < 1.844e+18 && -1.844e+18 < auVar25._4_4_);
        auVar27._8_4_ = -(uint)(auVar25._8_4_ < 1.844e+18 && -1.844e+18 < auVar25._8_4_);
        auVar27._12_4_ = -(uint)(auVar25._12_4_ < 1.844e+18 && -1.844e+18 < auVar25._12_4_);
        uVar12 = movmskps((int)(sVar13 * uVar16),auVar27);
        if ((~(byte)uVar12 & 7) != 0) goto LAB_00a584b0;
        auVar27 = *(undefined1 (*) [16])(pcVar6 + sVar13 * uVar18);
        auVar29._0_4_ = -(uint)(auVar27._0_4_ < 1.844e+18 && -1.844e+18 < auVar27._0_4_);
        auVar29._4_4_ = -(uint)(auVar27._4_4_ < 1.844e+18 && -1.844e+18 < auVar27._4_4_);
        auVar29._8_4_ = -(uint)(auVar27._8_4_ < 1.844e+18 && -1.844e+18 < auVar27._8_4_);
        auVar29._12_4_ = -(uint)(auVar27._12_4_ < 1.844e+18 && -1.844e+18 < auVar27._12_4_);
        uVar12 = movmskps((int)(sVar13 * uVar18),auVar29);
        if ((~(byte)uVar12 & 7) != 0) goto LAB_00a584b0;
        auVar29 = *(undefined1 (*) [16])(pcVar6 + sVar13 * uVar11);
        auVar2._4_4_ = -(uint)(auVar29._4_4_ < 1.844e+18 && -1.844e+18 < auVar29._4_4_);
        auVar2._0_4_ = -(uint)(auVar29._0_4_ < 1.844e+18 && -1.844e+18 < auVar29._0_4_);
        auVar2._8_4_ = -(uint)(auVar29._8_4_ < 1.844e+18 && -1.844e+18 < auVar29._8_4_);
        auVar2._12_4_ = -(uint)(auVar29._12_4_ < 1.844e+18 && -1.844e+18 < auVar29._12_4_);
        uVar12 = movmskps((int)(sVar13 * uVar11),auVar2);
        if ((~(byte)uVar12 & 7) != 0) goto LAB_00a584b0;
        auVar2 = *(undefined1 (*) [16])(pcVar6 + sVar13 * uVar15);
        auVar33._0_4_ = -(uint)(auVar2._0_4_ < 1.844e+18 && -1.844e+18 < auVar2._0_4_);
        auVar33._4_4_ = -(uint)(auVar2._4_4_ < 1.844e+18 && -1.844e+18 < auVar2._4_4_);
        auVar33._8_4_ = -(uint)(auVar2._8_4_ < 1.844e+18 && -1.844e+18 < auVar2._8_4_);
        auVar33._12_4_ = -(uint)(auVar2._12_4_ < 1.844e+18 && -1.844e+18 < auVar2._12_4_);
        uVar12 = movmskps((int)(sVar13 * uVar15),auVar33);
        if ((~(byte)uVar12 & 7) != 0) goto LAB_00a584b0;
        pcVar6 = pBVar4[itime + 1].super_RawBufferView.ptr_ofs;
        sVar13 = pBVar4[itime + 1].super_RawBufferView.stride;
        pfVar1 = (float *)(pcVar6 + uVar16 * sVar13);
        auVar35._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
        auVar35._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
        auVar35._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
        auVar35._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
        uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar35);
        if ((~(byte)uVar12 & 7) != 0) goto LAB_00a584b0;
        pfVar1 = (float *)(pcVar6 + uVar18 * sVar13);
        auVar30._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
        auVar30._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
        auVar30._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
        auVar30._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
        uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar30);
        if ((~(byte)uVar12 & 7) != 0) goto LAB_00a584b0;
        pfVar1 = (float *)(pcVar6 + uVar11 * sVar13);
        auVar31._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
        auVar31._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
        auVar31._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
        auVar31._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
        uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar31);
        if ((~(byte)uVar12 & 7) != 0) goto LAB_00a584b0;
        pfVar1 = (float *)(pcVar6 + sVar13 * uVar15);
        auVar32._0_4_ = -(uint)(*pfVar1 < 1.844e+18 && -1.844e+18 < *pfVar1);
        auVar32._4_4_ = -(uint)(pfVar1[1] < 1.844e+18 && -1.844e+18 < pfVar1[1]);
        auVar32._8_4_ = -(uint)(pfVar1[2] < 1.844e+18 && -1.844e+18 < pfVar1[2]);
        auVar32._12_4_ = -(uint)(pfVar1[3] < 1.844e+18 && -1.844e+18 < pfVar1[3]);
        uVar12 = movmskps(CONCAT31((int3)((uint)uVar12 >> 8),~(byte)uVar12),auVar32);
        bVar19 = ((byte)uVar12 & 7) == 7;
        if (bVar19) {
          auVar33 = minps(auVar25,auVar27);
          auVar35 = minps(auVar29,auVar2);
          auVar33 = minps(auVar33,auVar35);
          auVar25 = maxps(auVar25,auVar27);
          auVar27 = maxps(auVar29,auVar2);
          auVar25 = maxps(auVar25,auVar27);
          aVar28 = auVar33._0_12_;
          aVar24 = auVar25._0_12_;
        }
      }
      else {
LAB_00a584b0:
        bVar19 = false;
      }
      sVar13 = k;
      if (bVar19) {
        aVar34.m128[3] = (float)geomID;
        aVar34._0_4_ = aVar28.x;
        aVar34._4_4_ = aVar28.y;
        aVar34._8_4_ = aVar28.z;
        aVar26.m128[3] = (float)uVar14;
        aVar26._0_4_ = aVar24.x;
        aVar26._4_4_ = aVar24.y;
        aVar26._8_4_ = aVar24.z;
        aVar20.m128 = (__m128)minps(aVar20.m128,aVar34.m128);
        aVar21.m128 = (__m128)maxps(aVar21.m128,aVar26.m128);
        auVar25._0_4_ = aVar28.x + aVar24.x;
        auVar25._4_4_ = aVar28.y + aVar24.y;
        auVar25._8_4_ = aVar28.z + aVar24.z;
        auVar25._12_4_ = (float)geomID + (float)uVar14;
        aVar23.m128 = (__m128)minps(aVar23.m128,auVar25);
        aVar22.m128 = (__m128)maxps(aVar22.m128,auVar25);
        sVar10 = sVar10 + 1;
        sVar13 = k + 1;
        pPVar7 = prims->items;
        pPVar7[k].lower.field_0 = aVar34;
        pPVar7[k].upper.field_0 = aVar26;
      }
      uVar14 = uVar14 + 1;
      k = sVar13;
    } while (uVar14 < r->_end);
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar20;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar21;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar23;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar22;
  __return_storage_ptr__->end = sVar10;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(mvector<PrimRef>& prims, size_t itime, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          BBox3fa bounds = empty;
          if (!buildBounds(j,itime,bounds)) continue;
          const PrimRef prim(bounds,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }